

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int jitopt_param(jit_State *J,char *str)

{
  bool bVar1;
  int iVar2;
  ulong __n;
  char *local_48;
  char *p;
  int32_t n;
  size_t len;
  char *pcStack_28;
  int i;
  char *lst;
  char *str_local;
  jit_State *J_local;
  
  pcStack_28 = 
  "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\tminstitch\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
  ;
  len._4_4_ = 0;
  while( true ) {
    if (0xe < len._4_4_) {
      return 0;
    }
    __n = (ulong)(byte)*pcStack_28;
    iVar2 = strncmp(str,(char *)((byte *)pcStack_28 + 1),__n);
    if ((iVar2 == 0) && (str[__n] == '=')) break;
    pcStack_28 = (char *)((byte *)pcStack_28 + __n + 1);
    len._4_4_ = len._4_4_ + 1;
  }
  p._4_4_ = 0;
  local_48 = str + __n + 1;
  while( true ) {
    bVar1 = false;
    if ('/' < *local_48) {
      bVar1 = *local_48 < ':';
    }
    if (!bVar1) break;
    p._4_4_ = p._4_4_ * 10 + *local_48 + -0x30;
    local_48 = local_48 + 1;
  }
  if (*local_48 != '\0') {
    return 0;
  }
  J->param[len._4_4_] = p._4_4_;
  if (len._4_4_ == 6) {
    lj_dispatch_init_hotcount((global_State *)&J[-1].penalty[0x24].val);
  }
  return 1;
}

Assistant:

static int jitopt_param(jit_State *J, const char *str)
{
  const char *lst = JIT_P_STRING;
  int i;
  for (i = 0; i < JIT_P__MAX; i++) {
    size_t len = *(const uint8_t *)lst;
    lj_assertJ(len != 0, "bad JIT_P_STRING");
    if (strncmp(str, lst+1, len) == 0 && str[len] == '=') {
      int32_t n = 0;
      const char *p = &str[len+1];
      while (*p >= '0' && *p <= '9')
	n = n*10 + (*p++ - '0');
      if (*p) return 0;  /* Malformed number. */
      J->param[i] = n;
      if (i == JIT_P_hotloop)
	lj_dispatch_init_hotcount(J2G(J));
      return 1;  /* Ok. */
    }
    lst += 1+len;
  }
  return 0;  /* No match. */
}